

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O2

vector<libtorrent::open_file_state,_std::allocator<libtorrent::open_file_state>_> * __thiscall
libtorrent::torrent_handle::file_status
          (vector<libtorrent::open_file_state,_std::allocator<libtorrent::open_file_state>_>
           *__return_storage_ptr__,torrent_handle *this)

{
  _func_int **pp_Var1;
  shared_ptr<libtorrent::aux::torrent> t;
  __shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_20)
  ;
  if ((local_20._M_ptr == (element_type *)0x0) ||
     (((local_20._M_ptr)->m_storage).m_disk_io == (disk_interface *)0x0)) {
    (__return_storage_ptr__->
    super__Vector_base<libtorrent::open_file_state,_std::allocator<libtorrent::open_file_state>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<libtorrent::open_file_state,_std::allocator<libtorrent::open_file_state>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<libtorrent::open_file_state,_std::allocator<libtorrent::open_file_state>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    pp_Var1 = ((local_20._M_ptr)->super_torrent_hot_members).m_ses[0x22d].super_session_logger.
              _vptr_session_logger;
    (**(code **)(*pp_Var1 + 0x78))
              (__return_storage_ptr__,pp_Var1,((local_20._M_ptr)->m_storage).m_idx.m_val);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::vector<open_file_state> torrent_handle::file_status() const
	{
		auto t = m_torrent.lock();
		if (!t || !t->has_storage()) return {};
		auto& ses = static_cast<session_impl&>(t->session());
		return ses.disk_thread().get_status(t->storage());
	}